

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtApiAlsa::callbackEvent(RtApiAlsa *this)

{
  StreamMutex *__mutex;
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  code *pcVar4;
  undefined8 uVar5;
  RtAudioFormat format;
  _func_int *p_Var6;
  StreamState SVar7;
  int iVar8;
  uint uVar9;
  StreamMode SVar10;
  int iVar11;
  ostream *poVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 *puVar19;
  char *pcVar20;
  RtApiAlsa *this_00;
  RtApi *this_01;
  undefined1 *puVar21;
  pthread_mutex_t *__mutex_00;
  undefined8 uStack_90;
  undefined8 uStack_88;
  string local_80 [32];
  unsigned_long local_60;
  snd_pcm_sframes_t frames;
  ulong local_50;
  pthread_mutex_t *local_48;
  undefined1 *local_40;
  int local_34;
  
  puVar19 = &uStack_88;
  puVar3 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  SVar7 = (this->super_RtApi).stream_.state;
  if (SVar7 == STREAM_STOPPED) {
    __mutex = &(this->super_RtApi).stream_.mutex;
    uStack_90 = 0x10eb5a;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (*(char *)(puVar3 + 9) == '\0') {
      uStack_90 = 0x10eb70;
      pthread_cond_wait((pthread_cond_t *)(puVar3 + 3),(pthread_mutex_t *)__mutex);
    }
    SVar7 = (this->super_RtApi).stream_.state;
    uStack_90 = 0x10eb81;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (SVar7 != STREAM_RUNNING) {
      return;
    }
    SVar7 = (this->super_RtApi).stream_.state;
  }
  if (SVar7 == STREAM_CLOSED) {
    uStack_90 = 0x10eba9;
    std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
    uStack_90 = 1;
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return;
  }
  pcVar4 = (code *)(this->super_RtApi).stream_.callbackInfo.callback;
  uStack_90 = 0x10ebd2;
  (*(this->super_RtApi)._vptr_RtApi[9])(this);
  SVar10 = (this->super_RtApi).stream_.mode;
  uVar15 = 0;
  if (SVar10 == INPUT) {
LAB_0010ebf4:
    if (*(char *)((long)puVar3 + 0x12) == '\x01') {
      uVar15 = uVar15 | 1;
      *(undefined1 *)((long)puVar3 + 0x12) = 0;
    }
  }
  else {
    uVar15 = 0;
    if (*(char *)((long)puVar3 + 0x11) == '\x01') {
      *(undefined1 *)((long)puVar3 + 0x11) = 0;
      uVar15 = 2;
    }
    if (SVar10 != OUTPUT) goto LAB_0010ebf4;
  }
  uStack_90 = 0x10ec21;
  iVar8 = (*pcVar4)((this->super_RtApi).stream_.userBuffer[0],
                    (this->super_RtApi).stream_.userBuffer[1],(this->super_RtApi).stream_.bufferSize
                    ,uVar15,(this->super_RtApi).stream_.callbackInfo.userData);
  if (iVar8 == 2) {
    (*(this->super_RtApi)._vptr_RtApi[8])(this);
    return;
  }
  __mutex_00 = (pthread_mutex_t *)&(this->super_RtApi).stream_.mutex;
  uStack_90 = 0x10ec4f;
  this_00 = (RtApiAlsa *)__mutex_00;
  pthread_mutex_lock(__mutex_00);
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) goto LAB_0010f10f;
  SVar10 = (this->super_RtApi).stream_.mode;
  puVar19 = &uStack_88;
  local_48 = __mutex_00;
  local_34 = iVar8;
  if ((uint)(SVar10 + ~OUTPUT) < 2) {
    bVar1 = (this->super_RtApi).stream_.doConvertBuffer[1];
    pcVar13 = (this->super_RtApi).stream_.userBuffer[(ulong)bVar1 + 1];
    uVar15 = (this->super_RtApi).stream_.nUserChannels[(ulong)bVar1 * 2 + 1];
    puVar21 = (undefined1 *)(this->super_RtApi).stream_.deviceFormat[(ulong)bVar1 * 2 + -1];
    local_40 = puVar21;
    if ((this->super_RtApi).stream_.deviceInterleaved[1] == true) {
      this_01 = (RtApi *)puVar3[1];
      uStack_90 = 0x10ecb7;
      iVar8 = snd_pcm_readi(this_01,pcVar13,(this->super_RtApi).stream_.bufferSize);
      puVar19 = &uStack_88;
    }
    else {
      lVar14 = -((ulong)uVar15 * 8 + 0xf & 0xfffffffffffffff0);
      uVar2 = (this->super_RtApi).stream_.bufferSize;
      frames = (snd_pcm_sframes_t)&uStack_88;
      local_50 = (ulong)uVar15;
      *(undefined8 *)((long)&uStack_90 + lVar14) = 0x10eceb;
      uVar9 = RtApi::formatBytes(&this->super_RtApi,(RtAudioFormat)puVar21);
      uVar15 = (uint)local_50;
      uVar17 = 0;
      uVar18 = 0;
      pcVar20 = pcVar13;
      if (0 < (int)uVar15) {
        uVar18 = local_50 & 0xffffffff;
      }
      for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        *(char **)((long)&uStack_88 + lVar14 + uVar17 * 8) = pcVar20;
        pcVar20 = pcVar20 + uVar9 * uVar2;
      }
      this_01 = (RtApi *)puVar3[1];
      uVar2 = (this->super_RtApi).stream_.bufferSize;
      *(undefined8 *)((long)&uStack_90 + lVar14) = 0x10ed2a;
      iVar8 = snd_pcm_readn(this_01,(long)&uStack_88 + lVar14,uVar2);
      puVar19 = (undefined8 *)frames;
    }
    puVar21 = local_40;
    __mutex_00 = local_48;
    uVar2 = (this->super_RtApi).stream_.bufferSize;
    if (iVar8 < (int)uVar2) {
      if (iVar8 == -0x20) {
        uVar5 = puVar3[1];
        *(undefined8 *)((long)puVar19 + -8) = 0x10ed53;
        iVar8 = snd_pcm_state(uVar5);
        if (iVar8 != 4) {
          *(undefined8 *)((long)puVar19 + -8) = 0x10ee3b;
          poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                    "RtApiAlsa::callbackEvent: error, current state is ");
          *(undefined8 *)((long)puVar19 + -8) = 0x10ee46;
          pcVar13 = (char *)snd_pcm_state_name(iVar8);
          *(undefined8 *)((long)puVar19 + -8) = 0x10ee51;
          poVar12 = std::operator<<(poVar12,pcVar13);
          *(undefined8 *)((long)puVar19 + -8) = 0x10ee60;
          poVar12 = std::operator<<(poVar12,", ");
          *(undefined8 *)((long)puVar19 + -8) = 0xffffffffffffffe0;
          uVar5 = *(undefined8 *)((long)puVar19 + -8);
          *(undefined8 *)((long)puVar19 + -8) = 0x10ee6b;
          pcVar13 = (char *)snd_strerror(uVar5);
          goto LAB_0010ee6e;
        }
        *(undefined1 *)((long)puVar3 + 0x12) = 1;
        uVar5 = puVar3[1];
        *(undefined8 *)((long)puVar19 + -8) = 0x10ed6a;
        iVar8 = snd_pcm_prepare(uVar5);
        if (iVar8 < 0) {
          *(undefined8 *)((long)puVar19 + -8) = 0x10ed85;
          poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                    "RtApiAlsa::callbackEvent: error preparing device after overrun, "
                                   );
          goto LAB_0010ee1e;
        }
      }
      else {
        *(undefined8 *)((long)puVar19 + -8) = 0x10ee18;
        poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                  "RtApiAlsa::callbackEvent: audio read error, ");
LAB_0010ee1e:
        *(undefined8 *)((long)puVar19 + -8) = 0x10ee23;
        pcVar13 = (char *)snd_strerror(iVar8);
LAB_0010ee6e:
        *(undefined8 *)((long)puVar19 + -8) = 0x10ee76;
        poVar12 = std::operator<<(poVar12,pcVar13);
        *(undefined8 *)((long)puVar19 + -8) = 0x10ee85;
        std::operator<<(poVar12,".");
        *(undefined8 *)((long)puVar19 + -8) = 0x10ee95;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)((long)puVar19 + -8) = 0x10eea4;
        std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_80);
        *(undefined8 *)((long)puVar19 + -8) = 0x10eeac;
        std::__cxx11::string::~string(local_80);
      }
      *(undefined8 *)((long)puVar19 + -8) = 1;
      uVar5 = *(undefined8 *)((long)puVar19 + -8);
      *(undefined8 *)((long)puVar19 + -8) = 0x10eeb7;
      this_00 = this;
      RtApi::error(&this->super_RtApi,(RtAudioErrorType)uVar5);
    }
    else {
      if ((this->super_RtApi).stream_.doByteSwap[1] == true) {
        *(undefined8 *)((long)puVar19 + -8) = 0x10eda9;
        RtApi::byteSwapBuffer(this_01,pcVar13,uVar2 * uVar15,(RtAudioFormat)puVar21);
      }
      if ((this->super_RtApi).stream_.doConvertBuffer[1] == true) {
        pcVar13 = (this->super_RtApi).stream_.userBuffer[1];
        pcVar20 = (this->super_RtApi).stream_.deviceBuffer;
        *(undefined8 *)((long)puVar19 + -8) = 0x10edcf;
        RtApi::convertBuffer
                  (&this->super_RtApi,pcVar13,pcVar20,(this->super_RtApi).stream_.convertInfo + 1);
      }
      this_00 = (RtApiAlsa *)puVar3[1];
      *(undefined8 *)((long)puVar19 + -8) = 0x10eddf;
      iVar8 = snd_pcm_delay(this_00,&local_60);
      __mutex_00 = local_48;
      if (0 < (long)local_60 && iVar8 == 0) {
        (this->super_RtApi).stream_.latency[1] = local_60;
      }
    }
    SVar10 = (this->super_RtApi).stream_.mode;
  }
  iVar8 = local_34;
  if ((SVar10 & ~DUPLEX) != OUTPUT) goto LAB_0010f10f;
  if ((this->super_RtApi).stream_.doConvertBuffer[0] == true) {
    pcVar20 = (this->super_RtApi).stream_.userBuffer[0];
    pcVar13 = (this->super_RtApi).stream_.deviceBuffer;
    *(undefined8 *)((long)puVar19 + -8) = 0x10eef5;
    this_00 = this;
    RtApi::convertBuffer(&this->super_RtApi,pcVar13,pcVar20,(this->super_RtApi).stream_.convertInfo)
    ;
    lVar14 = 0x260;
    lVar16 = 0x234;
  }
  else {
    pcVar13 = (this->super_RtApi).stream_.userBuffer[0];
    lVar14 = 600;
    lVar16 = 0x22c;
  }
  uVar15 = *(uint *)((long)&(this->super_RtApi)._vptr_RtApi + lVar16);
  format = *(RtAudioFormat *)((long)&(this->super_RtApi)._vptr_RtApi + lVar14);
  puVar21 = (undefined1 *)(ulong)uVar15;
  if ((this->super_RtApi).stream_.doByteSwap[0] == true) {
    uVar2 = (this->super_RtApi).stream_.bufferSize;
    local_40 = (undefined1 *)(ulong)uVar15;
    *(undefined8 *)((long)puVar19 + -8) = 0x10ef3c;
    RtApi::byteSwapBuffer(&this_00->super_RtApi,pcVar13,uVar2 * uVar15,format);
    puVar21 = local_40;
  }
  if ((this->super_RtApi).stream_.deviceInterleaved[0] == true) {
    uVar5 = *puVar3;
    uVar15 = (this->super_RtApi).stream_.bufferSize;
    *(undefined8 *)((long)puVar19 + -8) = 0x10ef5e;
    iVar8 = snd_pcm_writei(uVar5,pcVar13,uVar15);
    __mutex_00 = local_48;
  }
  else {
    lVar14 = (long)puVar19 - ((long)puVar21 * 8 + 0xfU & 0xfffffffffffffff0);
    local_50 = CONCAT44(local_50._4_4_,(this->super_RtApi).stream_.bufferSize);
    local_40 = (undefined1 *)puVar19;
    *(undefined8 *)(lVar14 + -8) = 0x10ef94;
    uVar15 = RtApi::formatBytes(&this->super_RtApi,format);
    __mutex_00 = local_48;
    uVar15 = uVar15 * (int)local_50;
    uVar17 = 0;
    uVar18 = 0;
    if (0 < (int)puVar21) {
      uVar18 = (ulong)puVar21 & 0xffffffff;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      *(char **)(lVar14 + uVar17 * 8) = pcVar13;
      pcVar13 = pcVar13 + uVar15;
    }
    uVar5 = *puVar3;
    uVar15 = (this->super_RtApi).stream_.bufferSize;
    *(undefined8 *)(lVar14 + -8) = 0x10efcd;
    iVar8 = snd_pcm_writen(uVar5,lVar14,uVar15);
    puVar19 = (undefined8 *)local_40;
  }
  if ((int)(this->super_RtApi).stream_.bufferSize <= iVar8) {
    uVar5 = *puVar3;
    *(undefined8 *)((long)puVar19 + -8) = 0x10f033;
    iVar11 = snd_pcm_delay(uVar5,&local_60);
    iVar8 = local_34;
    if (0 < (long)local_60 && iVar11 == 0) {
      (this->super_RtApi).stream_.latency[0] = local_60;
    }
    goto LAB_0010f10f;
  }
  if (iVar8 == -0x20) {
    uVar5 = *puVar3;
    *(undefined8 *)((long)puVar19 + -8) = 0x10efec;
    iVar8 = snd_pcm_state(uVar5);
    if (iVar8 != 4) {
      *(undefined8 *)((long)puVar19 + -8) = 0x10f08f;
      poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                "RtApiAlsa::callbackEvent: error, current state is ");
      *(undefined8 *)((long)puVar19 + -8) = 0x10f09a;
      pcVar13 = (char *)snd_pcm_state_name(iVar8);
      *(undefined8 *)((long)puVar19 + -8) = 0x10f0a5;
      poVar12 = std::operator<<(poVar12,pcVar13);
      *(undefined8 *)((long)puVar19 + -8) = 0x10f0b4;
      poVar12 = std::operator<<(poVar12,", ");
      *(undefined8 *)((long)puVar19 + -8) = 0xffffffffffffffe0;
      uVar5 = *(undefined8 *)((long)puVar19 + -8);
      *(undefined8 *)((long)puVar19 + -8) = 0x10f0bf;
      pcVar13 = (char *)snd_strerror(uVar5);
      goto LAB_0010f0c2;
    }
    *(undefined1 *)((long)puVar3 + 0x11) = 1;
    uVar5 = *puVar3;
    *(undefined8 *)((long)puVar19 + -8) = 0x10f003;
    iVar8 = snd_pcm_prepare(uVar5);
    if (iVar8 < 0) {
      *(undefined8 *)((long)puVar19 + -8) = 0x10f150;
      poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                "RtApiAlsa::callbackEvent: error preparing device after underrun, ")
      ;
      goto LAB_0010f072;
    }
    *(undefined8 *)((long)puVar19 + -8) = 0x10f01e;
    std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
  }
  else {
    *(undefined8 *)((long)puVar19 + -8) = 0x10f06c;
    poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                              "RtApiAlsa::callbackEvent: audio write error, ");
LAB_0010f072:
    *(undefined8 *)((long)puVar19 + -8) = 0x10f077;
    pcVar13 = (char *)snd_strerror(iVar8);
LAB_0010f0c2:
    *(undefined8 *)((long)puVar19 + -8) = 0x10f0ca;
    poVar12 = std::operator<<(poVar12,pcVar13);
    *(undefined8 *)((long)puVar19 + -8) = 0x10f0d9;
    std::operator<<(poVar12,".");
    *(undefined8 *)((long)puVar19 + -8) = 0x10f0e9;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)((long)puVar19 + -8) = 0x10f0f8;
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_80);
    *(undefined8 *)((long)puVar19 + -8) = 0x10f100;
    std::__cxx11::string::~string(local_80);
  }
  iVar8 = local_34;
  *(undefined8 *)((long)puVar19 + -8) = 1;
  uVar5 = *(undefined8 *)((long)puVar19 + -8);
  *(undefined8 *)((long)puVar19 + -8) = 0x10f10f;
  RtApi::error(&this->super_RtApi,(RtAudioErrorType)uVar5);
LAB_0010f10f:
  *(undefined8 *)((long)puVar19 + -8) = 0x10f117;
  pthread_mutex_unlock(__mutex_00);
  *(undefined8 *)((long)puVar19 + -8) = 0x10f11f;
  RtApi::tickStreamTime(&this->super_RtApi);
  if (iVar8 == 1) {
    p_Var6 = (this->super_RtApi)._vptr_RtApi[7];
    *(undefined8 *)((long)puVar19 + -8) = 0x10f12e;
    (*p_Var6)(this);
  }
  return;
}

Assistant:

void RtApiAlsa :: callbackEvent()
{
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !apiInfo->runnable )
      pthread_cond_wait( &apiInfo->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiAlsa::callbackEvent(): the stream is closed ... this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  int doStopStream = 0;
  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  if ( stream_.mode != INPUT && apiInfo->xrun[0] == true ) {
    status |= RTAUDIO_OUTPUT_UNDERFLOW;
    apiInfo->xrun[0] = false;
  }
  if ( stream_.mode != OUTPUT && apiInfo->xrun[1] == true ) {
    status |= RTAUDIO_INPUT_OVERFLOW;
    apiInfo->xrun[1] = false;
  }
  doStopStream = callback( stream_.userBuffer[0], stream_.userBuffer[1],
                           stream_.bufferSize, streamTime, status, stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );

  // The state might change while waiting on a mutex.
  if ( stream_.state == STREAM_STOPPED ) goto unlock;

  int result;
  char *buffer;
  int channels;
  snd_pcm_t **handle;
  snd_pcm_sframes_t frames;
  RtAudioFormat format;
  handle = (snd_pcm_t **) apiInfo->handles;

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX ) {

    // Setup parameters.
    if ( stream_.doConvertBuffer[1] ) {
      buffer = stream_.deviceBuffer;
      channels = stream_.nDeviceChannels[1];
      format = stream_.deviceFormat[1];
    }
    else {
      buffer = stream_.userBuffer[1];
      channels = stream_.nUserChannels[1];
      format = stream_.userFormat;
    }

    // Read samples from device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[1] )
      result = snd_pcm_readi( handle[1], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_readn( handle[1], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or overrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[1] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[1] = true;
          result = snd_pcm_prepare( handle[1] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after overrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio read error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto tryOutput;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[1] )
      byteSwapBuffer( buffer, stream_.bufferSize * channels, format );

    // Do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[1] )
      convertBuffer( stream_.userBuffer[1], stream_.deviceBuffer, stream_.convertInfo[1] );

    // Check stream latency
    result = snd_pcm_delay( handle[1], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[1] = frames;
  }

 tryOutput:

  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {

    // Setup parameters and do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[0] ) {
      buffer = stream_.deviceBuffer;
      convertBuffer( buffer, stream_.userBuffer[0], stream_.convertInfo[0] );
      channels = stream_.nDeviceChannels[0];
      format = stream_.deviceFormat[0];
    }
    else {
      buffer = stream_.userBuffer[0];
      channels = stream_.nUserChannels[0];
      format = stream_.userFormat;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[0] )
      byteSwapBuffer(buffer, stream_.bufferSize * channels, format);

    // Write samples to device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[0] )
      result = snd_pcm_writei( handle[0], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_writen( handle[0], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or underrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[0] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[0] = true;
          result = snd_pcm_prepare( handle[0] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after underrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
          else
            errorText_ =  "RtApiAlsa::callbackEvent: audio write error, underrun.";
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio write error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto unlock;
    }

    // Check stream latency
    result = snd_pcm_delay( handle[0], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[0] = frames;
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );

  RtApi::tickStreamTime();
  if ( doStopStream == 1 ) this->stopStream();
}